

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestApp.cpp
# Opt level: O3

void NetworkEntry(void *param)

{
  undefined8 in_RAX;
  PacketIO *this;
  uint8_t addr [6];
  undefined6 local_18;
  undefined2 uStack_12;
  
  _local_18 = CONCAT26((short)((ulong)in_RAX >> 0x30),0x665500000000);
  _local_18 = CONCAT44(stack0xffffffffffffffec,0x4448bf10);
  DefaultStack::SetMACAddress(&tcpStack,(uint8_t *)&local_18);
  this = (PacketIO *)operator_new(0x120);
  PacketIO::PacketIO(this);
  PIO = this;
  DefaultStack::RegisterDataTransmitHandler(&tcpStack,TxData);
  osEvent::Notify(&StartEvent);
  PacketIO::Start(PIO,RxData);
  return;
}

Assistant:

void NetworkEntry(void* param)
{
    // This is just a made-up MAC address to user for testing
    uint8_t addr[] = {0x10, 0xBF, 0x48, 0x44, 0x55, 0x66};
    tcpStack.SetMACAddress(addr);

    //   Config.IPv4.Address[ 0 ] = 0;
    //   Config.IPv4.Address[ 1 ] = 0;
    //   Config.IPv4.Address[ 2 ] = 0;
    //   Config.IPv4.Address[ 3 ] = 0;

#ifdef _WIN32
    NetworkConfig& config = *(NetworkConfig*)param;
    char device[256];

    PacketIO::GetDevice(config.interfaceNumber, device, sizeof(device));
    printf("using device %s\n", device);
    // PacketIO::GetMACAddress( device, Config.MACAddress );

    PIO = new PacketIO(device);

    ProtocolMACEthernet::Initialize(PIO);

    StartEvent.Notify();

    // This method does not return...ever
    PIO->Start(packet_handler);
#elif __linux__
    PIO = new PacketIO();
    tcpStack.RegisterDataTransmitHandler(TxData);
    StartEvent.Notify();
    PIO->Start(RxData);
#endif
}